

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_long_Test::TestBody
          (ByteBufferTest_test_read_write_long_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int64_t long2;
  AssertionResult gtest_ar_1;
  int64_t long1;
  ByteBuffer byte_buffer2;
  ByteBuffer byte_buffer1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  long local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer local_38 [48];
  
  local_70 = 0xd15fc7c15;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,8);
  bidfx_public_api::tools::ByteBuffer::WriteLong((long)local_38);
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::ReadLong();
  testing::internal::CmpHelperEQ<long,long>
            (local_68,"long1","byte_buffer1.ReadLong()",&local_70,(long *)&local_88);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_ = (AssertHelperData *)0xfffffffd6259fcd3;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_68,8);
  bidfx_public_api::tools::ByteBuffer::WriteLong((long)local_68);
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::ReadLong();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_88,"long2","byte_buffer2.ReadLong()",(long *)&local_90,
             (long *)&local_98);
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_68);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_long)
{
    int64_t long1 = 56203443221;
    ByteBuffer byte_buffer1(8);
    byte_buffer1.WriteLong(long1);
    EXPECT_EQ(long1, byte_buffer1.ReadLong());

    int64_t long2 = -11234837293;
    ByteBuffer byte_buffer2(8);
    byte_buffer2.WriteLong(long2);
    EXPECT_EQ(long2, byte_buffer2.ReadLong());
}